

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.h
# Opt level: O1

EditVertexTrait * MeshLib::trait<MeshLib::EditVertexTrait,MeshLib::Vertex>(Vertex *v)

{
  EditVertexTrait *pEVar1;
  undefined8 *puVar2;
  Trait *pTVar3;
  
  pTVar3 = v->m_trait;
  while( true ) {
    if (pTVar3 == (Trait *)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = __assert_fail;
      __cxa_throw(puVar2,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    pEVar1 = (EditVertexTrait *)__dynamic_cast(pTVar3,&Trait::typeinfo,&EditVertexTrait::typeinfo,0)
    ;
    if (pEVar1 != (EditVertexTrait *)0x0) break;
    pTVar3 = pTVar3->m_next;
  }
  return pEVar1;
}

Assistant:

T & trait( V * v )
{
	Trait * pt = v->trait();
	while( pt != NULL )
	{
		T *t = dynamic_cast<T*>(pt);
		if(t)
			return *t;
		//if( typeid(*pt) == typeid(T) )
		//	return *((T*)pt);
		pt = pt->next();
	}
	throw std::bad_cast();
	return *((T*)v->trait());
}